

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_root.c
# Opt level: O2

int ARKodeRootInit(void *arkode_mem,int nrtfn,ARKRootFn g)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  long *plVar5;
  void *__ptr;
  void *pvVar6;
  void *pvVar7;
  int line;
  ulong uVar8;
  char *msgfmt;
  size_t sVar9;
  undefined1 auVar10 [16];
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    iVar3 = -0x15;
    line = 0x31;
    arkode_mem = (ARKodeMem)0x0;
    goto LAB_00155cee;
  }
  uVar2 = 0;
  if (0 < nrtfn) {
    if (*(long *)((long)arkode_mem + 0x98) == 0) {
      msgfmt = 
      "Time-stepping module missing fullrhs routine (required by requested solver configuration).";
      iVar3 = -0x16;
      line = 0x3d;
      goto LAB_00155cee;
    }
    iVar3 = arkAllocVec((ARKodeMem)arkode_mem,*(N_Vector *)((long)arkode_mem + 0x250),
                        (N_Vector *)((long)arkode_mem + 600));
    uVar2 = nrtfn;
    if (iVar3 == 0) {
      msgfmt = "A memory request failed.";
      iVar3 = -0x14;
      line = 0x44;
      goto LAB_00155cee;
    }
  }
  plVar5 = *(long **)((long)arkode_mem + 0x3d8);
  if (plVar5 == (long *)0x0) {
    plVar5 = (long *)malloc(0x88);
    *(long **)((long)arkode_mem + 0x3d8) = plVar5;
    if (plVar5 == (long *)0x0) {
      arkProcessError((ARKodeMem)arkode_mem,0,0x50,"ARKodeRootInit",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_root.c"
                      ,"Allocation of arkode_mem failed.");
      return -0x14;
    }
    *plVar5 = 0;
    *(undefined4 *)(plVar5 + 1) = 0;
    *(undefined4 *)((long)plVar5 + 100) = 0;
    plVar5[0xe] = 0;
    plVar5[2] = 0;
    plVar5[3] = 0;
    plVar5[7] = 0;
    plVar5[8] = 0;
    plVar5[9] = 0;
    *(undefined4 *)(plVar5 + 0xf) = 1;
    plVar5[0x10] = *(long *)((long)arkode_mem + 0x10);
    *(long *)((long)arkode_mem + 0x368) = *(long *)((long)arkode_mem + 0x368) + 5;
    *(long *)((long)arkode_mem + 0x370) = *(long *)((long)arkode_mem + 0x370) + 0xc;
    uVar4 = 0;
  }
  else {
    uVar4 = *(uint *)(plVar5 + 1);
    if (0 < (int)uVar4 && uVar2 != uVar4) {
      free((void *)plVar5[7]);
      lVar1 = *(long *)((long)arkode_mem + 0x3d8);
      *(undefined8 *)(lVar1 + 0x38) = 0;
      free(*(void **)(lVar1 + 0x40));
      lVar1 = *(long *)((long)arkode_mem + 0x3d8);
      *(undefined8 *)(lVar1 + 0x40) = 0;
      free(*(void **)(lVar1 + 0x48));
      lVar1 = *(long *)((long)arkode_mem + 0x3d8);
      *(undefined8 *)(lVar1 + 0x48) = 0;
      free(*(void **)(lVar1 + 0x10));
      lVar1 = *(long *)((long)arkode_mem + 0x3d8);
      *(undefined8 *)(lVar1 + 0x10) = 0;
      free(*(void **)(lVar1 + 0x18));
      lVar1 = *(long *)((long)arkode_mem + 0x3d8);
      *(undefined8 *)(lVar1 + 0x18) = 0;
      free(*(void **)(lVar1 + 0x70));
      plVar5 = *(long **)((long)arkode_mem + 0x3d8);
      plVar5[0xe] = 0;
      uVar4 = *(uint *)(plVar5 + 1);
      lVar1 = (long)(int)uVar4 * 3;
      auVar10._8_4_ = (int)lVar1;
      auVar10._0_8_ = lVar1;
      auVar10._12_4_ = (int)((ulong)lVar1 >> 0x20);
      *(long *)((long)arkode_mem + 0x368) =
           *(long *)((long)arkode_mem + 0x368) + (long)(int)uVar4 * -3;
      *(long *)((long)arkode_mem + 0x370) = *(long *)((long)arkode_mem + 0x370) - auVar10._8_8_;
    }
  }
  if (nrtfn < 1) {
    *(undefined4 *)(plVar5 + 1) = 0;
    *plVar5 = 0;
    return 0;
  }
  if (uVar2 == uVar4) {
    if ((ARKRootFn)*plVar5 == g) {
      return 0;
    }
    if (g != (ARKRootFn)0x0) {
      *plVar5 = (long)g;
      return 0;
    }
    free((void *)plVar5[7]);
    lVar1 = *(long *)((long)arkode_mem + 0x3d8);
    *(undefined8 *)(lVar1 + 0x38) = 0;
    free(*(void **)(lVar1 + 0x40));
    lVar1 = *(long *)((long)arkode_mem + 0x3d8);
    *(undefined8 *)(lVar1 + 0x40) = 0;
    free(*(void **)(lVar1 + 0x48));
    lVar1 = *(long *)((long)arkode_mem + 0x3d8);
    *(undefined8 *)(lVar1 + 0x48) = 0;
    free(*(void **)(lVar1 + 0x10));
    lVar1 = *(long *)((long)arkode_mem + 0x3d8);
    *(undefined8 *)(lVar1 + 0x10) = 0;
    free(*(void **)(lVar1 + 0x18));
    lVar1 = *(long *)((long)arkode_mem + 0x3d8);
    *(undefined8 *)(lVar1 + 0x18) = 0;
    free(*(void **)(lVar1 + 0x70));
    *(undefined8 *)(*(long *)((long)arkode_mem + 0x3d8) + 0x70) = 0;
    *(ulong *)((long)arkode_mem + 0x368) = *(long *)((long)arkode_mem + 0x368) - (ulong)(uVar2 * 3);
    *(ulong *)((long)arkode_mem + 0x370) = *(long *)((long)arkode_mem + 0x370) - (ulong)(uVar2 * 3);
    msgfmt = "g = NULL illegal.";
    iVar3 = -0x16;
    line = 0x9e;
  }
  else {
    *(uint *)(plVar5 + 1) = uVar2;
    if (g == (ARKRootFn)0x0) {
      msgfmt = "g = NULL illegal.";
      iVar3 = -0x16;
      line = 0xaf;
    }
    else {
      *plVar5 = (long)g;
      sVar9 = (ulong)uVar2 * 8;
      __ptr = malloc(sVar9);
      plVar5[7] = (long)__ptr;
      if (__ptr == (void *)0x0) {
        msgfmt = "A memory request failed.";
        iVar3 = -0x14;
        line = 0xba;
      }
      else {
        pvVar6 = malloc(sVar9);
        plVar5[8] = (long)pvVar6;
        if (pvVar6 == (void *)0x0) {
          free(__ptr);
          plVar5[7] = 0;
          msgfmt = "A memory request failed.";
          iVar3 = -0x14;
          line = 0xc4;
        }
        else {
          pvVar6 = malloc(sVar9);
          plVar5[9] = (long)pvVar6;
          if (pvVar6 == (void *)0x0) {
            free(__ptr);
            plVar5[7] = 0;
            free((void *)plVar5[8]);
            *(undefined8 *)(*(long *)((long)arkode_mem + 0x3d8) + 0x40) = 0;
            msgfmt = "A memory request failed.";
            iVar3 = -0x14;
            line = 0xd0;
          }
          else {
            sVar9 = (ulong)uVar2 << 2;
            pvVar6 = malloc(sVar9);
            plVar5[2] = (long)pvVar6;
            if (pvVar6 == (void *)0x0) {
              free(__ptr);
              plVar5[7] = 0;
              free((void *)plVar5[8]);
              lVar1 = *(long *)((long)arkode_mem + 0x3d8);
              *(undefined8 *)(lVar1 + 0x40) = 0;
              free(*(void **)(lVar1 + 0x48));
              *(undefined8 *)(*(long *)((long)arkode_mem + 0x3d8) + 0x48) = 0;
              msgfmt = "A memory request failed.";
              iVar3 = -0x14;
              line = 0xde;
            }
            else {
              pvVar6 = malloc(sVar9);
              plVar5[3] = (long)pvVar6;
              if (pvVar6 == (void *)0x0) {
                free(__ptr);
                plVar5[7] = 0;
                free((void *)plVar5[8]);
                lVar1 = *(long *)((long)arkode_mem + 0x3d8);
                *(undefined8 *)(lVar1 + 0x40) = 0;
                free(*(void **)(lVar1 + 0x48));
                lVar1 = *(long *)((long)arkode_mem + 0x3d8);
                *(undefined8 *)(lVar1 + 0x48) = 0;
                free(*(void **)(lVar1 + 0x10));
                *(undefined8 *)(*(long *)((long)arkode_mem + 0x3d8) + 0x10) = 0;
                msgfmt = "A memory request failed.";
                iVar3 = -0x14;
                line = 0xee;
              }
              else {
                pvVar7 = malloc(sVar9);
                plVar5[0xe] = (long)pvVar7;
                if (pvVar7 != (void *)0x0) {
                  for (uVar8 = 0; (uint)nrtfn != uVar8; uVar8 = uVar8 + 1) {
                    *(undefined4 *)((long)pvVar6 + uVar8 * 4) = 0;
                  }
                  for (uVar8 = 0; (uint)nrtfn != uVar8; uVar8 = uVar8 + 1) {
                    *(undefined4 *)((long)pvVar7 + uVar8 * 4) = 1;
                  }
                  *(ulong *)((long)arkode_mem + 0x368) =
                       (ulong)(uVar2 * 3) + *(long *)((long)arkode_mem + 0x368);
                  *(ulong *)((long)arkode_mem + 0x370) =
                       (ulong)(uVar2 * 3) + *(long *)((long)arkode_mem + 0x370);
                  return 0;
                }
                free(__ptr);
                plVar5[7] = 0;
                free((void *)plVar5[8]);
                lVar1 = *(long *)((long)arkode_mem + 0x3d8);
                *(undefined8 *)(lVar1 + 0x40) = 0;
                free(*(void **)(lVar1 + 0x48));
                lVar1 = *(long *)((long)arkode_mem + 0x3d8);
                *(undefined8 *)(lVar1 + 0x48) = 0;
                free(*(void **)(lVar1 + 0x10));
                lVar1 = *(long *)((long)arkode_mem + 0x3d8);
                *(undefined8 *)(lVar1 + 0x10) = 0;
                free(*(void **)(lVar1 + 0x18));
                *(undefined8 *)(*(long *)((long)arkode_mem + 0x3d8) + 0x18) = 0;
                msgfmt = "A memory request failed.";
                iVar3 = -0x14;
                line = 0x101;
              }
            }
          }
        }
      }
    }
  }
LAB_00155cee:
  arkProcessError((ARKodeMem)arkode_mem,iVar3,line,"ARKodeRootInit",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_root.c"
                  ,msgfmt);
  return iVar3;
}

Assistant:

int ARKodeRootInit(void* arkode_mem, int nrtfn, ARKRootFn g)
{
  int i, nrt;

  /* unpack ark_mem */
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;
  nrt     = (nrtfn < 0) ? 0 : nrtfn;

  /* Ensure that stepper provides fullrhs function */
  if (nrt > 0)
  {
    if (!(ark_mem->step_fullrhs))
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_ARK_MISSING_FULLRHS);
      return ARK_ILL_INPUT;
    }

    if (!arkAllocVec(ark_mem, ark_mem->yn, &ark_mem->fn))
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      MSG_ARK_MEM_FAIL);
      return (ARK_MEM_FAIL);
    }
  }

  /* If unallocated, allocate rootfinding structure, set defaults, update space */
  if (ark_mem->root_mem == NULL)
  {
    ark_mem->root_mem = (ARKodeRootMem)malloc(sizeof(struct ARKodeRootMemRec));
    if (ark_mem->root_mem == NULL)
    {
      arkProcessError(ark_mem, 0, __LINE__, __func__, __FILE__,
                      MSG_ARK_ARKMEM_FAIL);
      return (ARK_MEM_FAIL);
    }
    ark_mem->root_mem->glo       = NULL;
    ark_mem->root_mem->ghi       = NULL;
    ark_mem->root_mem->grout     = NULL;
    ark_mem->root_mem->iroots    = NULL;
    ark_mem->root_mem->rootdir   = NULL;
    ark_mem->root_mem->gfun      = NULL;
    ark_mem->root_mem->nrtfn     = 0;
    ark_mem->root_mem->irfnd     = 0;
    ark_mem->root_mem->gactive   = NULL;
    ark_mem->root_mem->mxgnull   = 1;
    ark_mem->root_mem->root_data = ark_mem->user_data;

    ark_mem->lrw += ARK_ROOT_LRW;
    ark_mem->liw += ARK_ROOT_LIW;
  }

  /* If rerunning ARKodeRootInit() with a different number of root
     functions (changing number of gfun components), then free
     currently held memory resources */
  if ((nrt != ark_mem->root_mem->nrtfn) && (ark_mem->root_mem->nrtfn > 0))
  {
    free(ark_mem->root_mem->glo);
    ark_mem->root_mem->glo = NULL;
    free(ark_mem->root_mem->ghi);
    ark_mem->root_mem->ghi = NULL;
    free(ark_mem->root_mem->grout);
    ark_mem->root_mem->grout = NULL;
    free(ark_mem->root_mem->iroots);
    ark_mem->root_mem->iroots = NULL;
    free(ark_mem->root_mem->rootdir);
    ark_mem->root_mem->rootdir = NULL;
    free(ark_mem->root_mem->gactive);
    ark_mem->root_mem->gactive = NULL;

    ark_mem->lrw -= 3 * (ark_mem->root_mem->nrtfn);
    ark_mem->liw -= 3 * (ark_mem->root_mem->nrtfn);
  }

  /* If ARKodeRootInit() was called with nrtfn == 0, then set
     nrtfn to zero and gfun to NULL before returning */
  if (nrt == 0)
  {
    ark_mem->root_mem->nrtfn = nrt;
    ark_mem->root_mem->gfun  = NULL;
    return (ARK_SUCCESS);
  }

  /* If rerunning ARKodeRootInit() with the same number of root
     functions (not changing number of gfun components), then
     check if the root function argument has changed */
  /* If g != NULL then return as currently reserved memory
     resources will suffice */
  if (nrt == ark_mem->root_mem->nrtfn)
  {
    if (g != ark_mem->root_mem->gfun)
    {
      if (g == NULL)
      {
        free(ark_mem->root_mem->glo);
        ark_mem->root_mem->glo = NULL;
        free(ark_mem->root_mem->ghi);
        ark_mem->root_mem->ghi = NULL;
        free(ark_mem->root_mem->grout);
        ark_mem->root_mem->grout = NULL;
        free(ark_mem->root_mem->iroots);
        ark_mem->root_mem->iroots = NULL;
        free(ark_mem->root_mem->rootdir);
        ark_mem->root_mem->rootdir = NULL;
        free(ark_mem->root_mem->gactive);
        ark_mem->root_mem->gactive = NULL;

        ark_mem->lrw -= 3 * nrt;
        ark_mem->liw -= 3 * nrt;

        arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                        MSG_ARK_NULL_G);
        return (ARK_ILL_INPUT);
      }
      else
      {
        ark_mem->root_mem->gfun = g;
        return (ARK_SUCCESS);
      }
    }
    else { return (ARK_SUCCESS); }
  }

  /* Set variable values in ARKODE memory block */
  ark_mem->root_mem->nrtfn = nrt;
  if (g == NULL)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_G);
    return (ARK_ILL_INPUT);
  }
  else { ark_mem->root_mem->gfun = g; }

  /* Allocate necessary memory and return */
  ark_mem->root_mem->glo = NULL;
  ark_mem->root_mem->glo = (sunrealtype*)malloc(nrt * sizeof(sunrealtype));
  if (ark_mem->root_mem->glo == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_MEM_FAIL);
    return (ARK_MEM_FAIL);
  }
  ark_mem->root_mem->ghi = NULL;
  ark_mem->root_mem->ghi = (sunrealtype*)malloc(nrt * sizeof(sunrealtype));
  if (ark_mem->root_mem->ghi == NULL)
  {
    free(ark_mem->root_mem->glo);
    ark_mem->root_mem->glo = NULL;
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_MEM_FAIL);
    return (ARK_MEM_FAIL);
  }
  ark_mem->root_mem->grout = NULL;
  ark_mem->root_mem->grout = (sunrealtype*)malloc(nrt * sizeof(sunrealtype));
  if (ark_mem->root_mem->grout == NULL)
  {
    free(ark_mem->root_mem->glo);
    ark_mem->root_mem->glo = NULL;
    free(ark_mem->root_mem->ghi);
    ark_mem->root_mem->ghi = NULL;
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_MEM_FAIL);
    return (ARK_MEM_FAIL);
  }
  ark_mem->root_mem->iroots = NULL;
  ark_mem->root_mem->iroots = (int*)malloc(nrt * sizeof(int));
  if (ark_mem->root_mem->iroots == NULL)
  {
    free(ark_mem->root_mem->glo);
    ark_mem->root_mem->glo = NULL;
    free(ark_mem->root_mem->ghi);
    ark_mem->root_mem->ghi = NULL;
    free(ark_mem->root_mem->grout);
    ark_mem->root_mem->grout = NULL;
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_MEM_FAIL);
    return (ARK_MEM_FAIL);
  }
  ark_mem->root_mem->rootdir = NULL;
  ark_mem->root_mem->rootdir = (int*)malloc(nrt * sizeof(int));
  if (ark_mem->root_mem->rootdir == NULL)
  {
    free(ark_mem->root_mem->glo);
    ark_mem->root_mem->glo = NULL;
    free(ark_mem->root_mem->ghi);
    ark_mem->root_mem->ghi = NULL;
    free(ark_mem->root_mem->grout);
    ark_mem->root_mem->grout = NULL;
    free(ark_mem->root_mem->iroots);
    ark_mem->root_mem->iroots = NULL;
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_MEM_FAIL);
    return (ARK_MEM_FAIL);
  }
  ark_mem->root_mem->gactive = NULL;
  ark_mem->root_mem->gactive =
    (sunbooleantype*)malloc(nrt * sizeof(sunbooleantype));
  if (ark_mem->root_mem->gactive == NULL)
  {
    free(ark_mem->root_mem->glo);
    ark_mem->root_mem->glo = NULL;
    free(ark_mem->root_mem->ghi);
    ark_mem->root_mem->ghi = NULL;
    free(ark_mem->root_mem->grout);
    ark_mem->root_mem->grout = NULL;
    free(ark_mem->root_mem->iroots);
    ark_mem->root_mem->iroots = NULL;
    free(ark_mem->root_mem->rootdir);
    ark_mem->root_mem->rootdir = NULL;
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_MEM_FAIL);
    return (ARK_MEM_FAIL);
  }

  /* Set default values for rootdir (both directions) */
  for (i = 0; i < nrt; i++) { ark_mem->root_mem->rootdir[i] = 0; }

  /* Set default values for gactive (all active) */
  for (i = 0; i < nrt; i++) { ark_mem->root_mem->gactive[i] = SUNTRUE; }

  ark_mem->lrw += 3 * nrt;
  ark_mem->liw += 3 * nrt;

  return (ARK_SUCCESS);
}